

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bacNtk.c
# Opt level: O2

int Bac_NtkDfsUserBoxes_rec(Bac_Ntk_t *p,int iObj,Vec_Int_t *vBoxes)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int i;
  
  iVar1 = Bac_ObjIsBoxUser(p,iObj);
  if (iVar1 == 0) {
    __assert_fail("Bac_ObjIsBoxUser(p, iObj)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/bac/bacNtk.c"
                  ,0x1e4,"int Bac_NtkDfsUserBoxes_rec(Bac_Ntk_t *, int, Vec_Int_t *)");
  }
  iVar1 = Vec_IntEntry(&p->vCopy,iObj);
  if (iVar1 == 1) {
    iVar1 = 1;
  }
  else {
    iVar1 = Vec_IntEntry(&p->vCopy,iObj);
    if (iVar1 == 0) {
LAB_0031c2d2:
      iVar1 = 0;
    }
    else {
      iVar1 = 0;
      Bac_ObjSetCopy(p,iObj,0);
      for (i = iObj + -1; -1 < i; i = i + -1) {
        iVar2 = Bac_ObjIsBi(p,i);
        if (iVar2 == 0) break;
        iVar2 = Bac_BoxFanin(p,iObj,iVar1);
        iVar3 = Bac_ObjIsBo(p,iVar2);
        if (iVar3 != 0) {
          iVar3 = Bac_ObjFanin(p,iVar2);
          iVar3 = Bac_ObjIsBoxUser(p,iVar3);
          if (iVar3 != 0) {
            iVar2 = Bac_ObjFanin(p,iVar2);
            iVar2 = Bac_NtkDfsUserBoxes_rec(p,iVar2,vBoxes);
            if (iVar2 == 0) goto LAB_0031c2d2;
          }
        }
        iVar1 = iVar1 + 1;
      }
      Vec_IntPush(vBoxes,iObj);
      iVar1 = 1;
      Bac_ObjSetCopy(p,iObj,1);
    }
  }
  return iVar1;
}

Assistant:

int Bac_NtkDfsUserBoxes_rec( Bac_Ntk_t * p, int iObj, Vec_Int_t * vBoxes )
{
    int k, iFanin;
    assert( Bac_ObjIsBoxUser(p, iObj) );
    if ( Bac_ObjCopy(p, iObj) == 1 ) // visited
        return 1;
    if ( Bac_ObjCopy(p, iObj) == 0 ) // loop
        return 0;
    Bac_ObjSetCopy( p, iObj, 0 );
    Bac_BoxForEachFanin( p, iObj, iFanin, k )
        if ( Bac_ObjIsBo(p, iFanin) && Bac_ObjIsBoxUser(p, Bac_ObjFanin(p, iFanin)) )
            if ( !Bac_NtkDfsUserBoxes_rec( p, Bac_ObjFanin(p, iFanin), vBoxes ) )
                return 0;
    Vec_IntPush( vBoxes, iObj );
    Bac_ObjSetCopy( p, iObj, 1 );
    return 1;
}